

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

HT_Mutex * ht_mutex_create(void)

{
  HT_Mutex *mtx;
  
  mtx = (HT_Mutex *)ht_alloc(0x28);
  if (mtx == (HT_Mutex *)0x0) {
    mtx = (HT_Mutex *)0x0;
  }
  else {
    memset(mtx,0,0x28);
    std::mutex::mutex((mutex *)mtx);
  }
  return mtx;
}

Assistant:

HT_Mutex*
ht_mutex_create(void)
{
    HT_Mutex* mtx = HT_CREATE_TYPE(HT_Mutex);

    if (mtx == NULL)
    {
        return NULL;
    }

#ifdef HT_MUTEX_IMPL_CPP11
    new (&mtx->mtx) std::mutex();
#elif defined(HT_MUTEX_IMPL_POSIX)
    pthread_mutex_init(&mtx->mtx, NULL);
#elif defined(HT_MUTEX_IMPL_WIN32)
    mtx->mtx = CreateMutex(0, FALSE, 0);
#endif

    return mtx;
}